

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O2

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)74,unsigned_short,CPU::MC68000::ProcessorBase>
               (uint32_t source,unsigned_short *destination,Status *status,
               ProcessorBase *flow_controller)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  FlagT FVar4;
  
  uVar2 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar2 + 1;
  if (uVar2 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
    uVar3 = (uint)*destination;
  }
  else {
    uVar1 = *destination;
    FVar4 = (FlagT)((uVar1 >> (uVar2 - 1 & 0x1f) & 1) != 0);
    if (0x10 < uVar2) {
      FVar4 = 0;
    }
    status->extend_flag = FVar4;
    status->carry_flag = FVar4;
    status->overflow_flag = 0;
    uVar3 = (uint)(int)(short)uVar1 >> 0xf;
    if (uVar2 < 0x10) {
      uVar3 = uVar3 << (0x10 - (byte)uVar2 & 0x1f) | (uint)(uVar1 >> ((byte)uVar2 & 0x1f));
    }
    *destination = (unsigned_short)uVar3;
  }
  status->zero_result = (ulong)(uVar3 & 0xffff);
  status->negative_flag = (ulong)(uVar3 & 0x8000);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}